

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O2

btMatrix3x3 * __thiscall btMatrix3x3::operator+=(btMatrix3x3 *this,btMatrix3x3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  
  fVar1 = this->m_el[0].m_floats[2];
  fVar2 = m->m_el[0].m_floats[2];
  fVar3 = this->m_el[1].m_floats[2];
  fVar4 = m->m_el[1].m_floats[2];
  fVar5 = this->m_el[2].m_floats[2];
  fVar6 = m->m_el[2].m_floats[2];
  uVar7 = *(undefined8 *)this->m_el[0].m_floats;
  uVar8 = *(undefined8 *)m->m_el[0].m_floats;
  uVar9 = *(undefined8 *)m->m_el[1].m_floats;
  uVar10 = *(undefined8 *)m->m_el[2].m_floats;
  uVar11 = *(undefined8 *)this->m_el[1].m_floats;
  uVar12 = *(undefined8 *)this->m_el[2].m_floats;
  *(ulong *)this->m_el[0].m_floats =
       CONCAT44((float)((ulong)uVar8 >> 0x20) + (float)((ulong)uVar7 >> 0x20),
                (float)uVar8 + (float)uVar7);
  this->m_el[0].m_floats[2] = fVar1 + fVar2;
  this->m_el[0].m_floats[3] = 0.0;
  *(ulong *)this->m_el[1].m_floats =
       CONCAT44((float)((ulong)uVar11 >> 0x20) + (float)((ulong)uVar9 >> 0x20),
                (float)uVar11 + (float)uVar9);
  this->m_el[1].m_floats[2] = fVar3 + fVar4;
  this->m_el[1].m_floats[3] = 0.0;
  *(ulong *)this->m_el[2].m_floats =
       CONCAT44((float)((ulong)uVar12 >> 0x20) + (float)((ulong)uVar10 >> 0x20),
                (float)uVar12 + (float)uVar10);
  this->m_el[2].m_floats[2] = fVar5 + fVar6;
  this->m_el[2].m_floats[3] = 0.0;
  return this;
}

Assistant:

SIMD_FORCE_INLINE btMatrix3x3& 
btMatrix3x3::operator+=(const btMatrix3x3& m)
{
#if (defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE))|| defined (BT_USE_NEON)
    m_el[0].mVec128 = m_el[0].mVec128 + m.m_el[0].mVec128;
    m_el[1].mVec128 = m_el[1].mVec128 + m.m_el[1].mVec128;
    m_el[2].mVec128 = m_el[2].mVec128 + m.m_el[2].mVec128;
#else
	setValue(
		m_el[0][0]+m.m_el[0][0], 
		m_el[0][1]+m.m_el[0][1],
		m_el[0][2]+m.m_el[0][2],
		m_el[1][0]+m.m_el[1][0], 
		m_el[1][1]+m.m_el[1][1],
		m_el[1][2]+m.m_el[1][2],
		m_el[2][0]+m.m_el[2][0], 
		m_el[2][1]+m.m_el[2][1],
		m_el[2][2]+m.m_el[2][2]);
#endif
	return *this;
}